

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O3

void u8_to_U_test(int line,UTF_S8 *str1,UTF_US32 *str2,bool ok)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  char32_t *pcVar4;
  char32_t cVar5;
  size_type sVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  UTF_US32 tmp;
  UTF_UC32 buf [256];
  byte abStack_44c [4];
  UTF_US32 local_448;
  char32_t local_428 [256];
  
  local_448._M_string_length = 0;
  local_448.field_2._M_local_buf[0] = L'\0';
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  bVar3 = UTF_u8_to_U<(char)63>((UTF_US8 *)str1,&local_448);
  UTF_test(line,bVar3 == ok);
  uVar2 = str2->_M_string_length;
  sVar6 = local_448._M_string_length;
  if (uVar2 < local_448._M_string_length) {
    sVar6 = uVar2;
  }
  if (sVar6 != 0) {
    uVar11 = 0;
    do {
      if ((str2->_M_dataplus)._M_p[uVar11] != local_448._M_dataplus._M_p[uVar11]) {
        bVar3 = false;
        goto LAB_001017b5;
      }
      uVar11 = uVar11 + 1;
    } while (sVar6 != uVar11);
  }
  bVar3 = local_448._M_string_length == uVar2;
LAB_001017b5:
  UTF_test(line,bVar3);
  bVar3 = true;
  if (str1->_M_string_length == 0) {
    pcVar4 = local_428;
  }
  else {
    pbVar8 = (byte *)(str1->_M_dataplus)._M_p;
    pbVar7 = pbVar8 + str1->_M_string_length;
    lVar10 = 0;
    do {
      lVar9 = lVar10;
      pcVar4 = (char32_t *)((long)local_428 + lVar9);
      bVar1 = *pbVar8;
      uVar12 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        lVar10 = 2;
        if (((0x1d < (byte)(bVar1 + 0x3e)) && (lVar10 = 3, (bVar1 & 0xf0) != 0xe0)) &&
           (lVar10 = 4, (bVar1 & 0xf8) != 0xf0)) {
          uVar12 = 0x3f;
          goto LAB_001017e7;
        }
        lVar13 = 1;
        do {
          pbVar8 = pbVar8 + 1;
          if (pbVar8 == pbVar7) {
            if (lVar9 == 0x3fc) goto LAB_00101984;
            *pcVar4 = L'?';
            pcVar4 = (char32_t *)((long)local_428 + lVar9 + 4);
            goto LAB_001019a3;
          }
          abStack_44c[lVar13] = *pbVar8;
          lVar13 = lVar13 + 1;
        } while (lVar10 != lVar13);
        if ((byte)(bVar1 + 0x3e) < 0x1e) {
          if (((char)abStack_44c[1] < -0x40) && ((bVar1 & 0x1e) != 0)) {
            uVar12 = abStack_44c[1] & 0x3f | (uVar12 & 0x1f) << 6;
            goto LAB_001017e7;
          }
        }
        else if ((bVar1 & 0xf0) == 0xe0) {
          if (((char)abStack_44c[1] < -0x40) && ((char)abStack_44c[2] < -0x40)) {
            if ((abStack_44c[1] & 0x20) != 0 || (char)(uVar12 & 0xf) != '\0') {
              uVar12 = abStack_44c[2] & 0x3f | (abStack_44c[1] & 0x3f) << 6 | (uVar12 & 0xf) << 0xc;
              goto LAB_001017e7;
            }
          }
        }
        else if ((((bVar1 & 0xf8) == 0xf0) && ((char)abStack_44c[1] < -0x40)) &&
                (((char)abStack_44c[2] < -0x40 && ((char)abStack_44c[3] < -0x40)))) {
          if ((abStack_44c[1] & 0x30) != 0 || (bVar1 & 7) != 0) {
            uVar12 = abStack_44c[3] & 0x3f |
                     (abStack_44c[2] & 0x3f) << 6 |
                     (abStack_44c[1] & 0x3f) << 0xc | (uint)(bVar1 & 7) << 0x12;
            goto LAB_001017e7;
          }
        }
LAB_00101984:
        bVar3 = false;
        goto LAB_001019a3;
      }
LAB_001017e7:
      if (lVar9 == 0x3fc) goto LAB_00101984;
      *(uint *)((long)local_428 + lVar9) = uVar12;
      pbVar8 = pbVar8 + 1;
      lVar10 = lVar9 + 4;
    } while (pbVar8 != pbVar7);
    pcVar4 = (char32_t *)((long)local_428 + lVar9 + 4);
  }
LAB_001019a3:
  *pcVar4 = L'\0';
  UTF_test(line,bVar3);
  cVar5 = *local_448._M_dataplus._M_p;
  if (cVar5 == L'\0') {
    cVar5 = L'\0';
    pcVar4 = local_428;
  }
  else {
    pcVar4 = local_428;
    lVar10 = 0;
    do {
      if (*pcVar4 == L'\0') goto LAB_00101a00;
      bVar3 = local_448._M_string_length + 1 == lVar10;
      if ((cVar5 != *pcVar4) || (local_448._M_string_length + 1 == lVar10)) goto LAB_00101a06;
      pcVar4 = pcVar4 + 1;
      cVar5 = local_448._M_dataplus._M_p[lVar10 + 1];
      lVar10 = lVar10 + 1;
    } while (cVar5 != L'\0');
    cVar5 = L'\0';
  }
LAB_00101a00:
  bVar3 = cVar5 == *pcVar4;
LAB_00101a06:
  UTF_test(line,bVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  return;
}

Assistant:

void u8_to_U_test(int line, const UTF_S8& str1, const UTF_US32& str2, bool ok)
{
    UTF_US32 tmp;
    UTF_UC32 buf[256];
    UTF_test(line, UTF_u8_to_U<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj32(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj32_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}